

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

bool __thiscall GGSock::Communicator::Data::update(Data *this)

{
  char cVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->isServer == true) {
    if (this->isListening == true) {
      doListen(this);
      goto LAB_0010af37;
    }
    if ((this->isListening != false) || (this->isConnected == false)) goto LAB_0010af0e;
  }
  else {
LAB_0010af0e:
    if (this->isServer != false) goto LAB_0010af37;
    if (this->isConnecting == true) {
      doConnect(this);
      goto LAB_0010af37;
    }
    if ((this->isConnecting != false) || (this->isConnected != true)) goto LAB_0010af37;
  }
  doRead(this);
LAB_0010af37:
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutexSend);
  if (iVar2 == 0) {
    cVar1 = this->isConnected;
    if (((bool)cVar1 == true) && (this->rbHead != this->rbEnd)) {
      doSend(this);
      cVar1 = this->isConnected;
    }
    if (cVar1 == '\0') {
      this->rbHead = this->rbEnd;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutexSend);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return true;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool update() {
            std::lock_guard<std::mutex> lock(mutex);
            if (isServer && isListening) {
                doListen();
            } else if (isServer && isListening == false && isConnected) {
                doRead();
            } else if (isServer == false && isConnecting) {
                doConnect();
            } else if (isServer == false && isConnecting == false && isConnected) {
                doRead();
            }
            {
                std::lock_guard<std::mutex> lock(mutexSend);
                if (isConnected && (rbHead != rbEnd)) {
                    doSend();
                }
                if (isConnected == false) {
                    rbHead = rbEnd;
                }
            }

            return true;
        }